

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstEvaluateVisitor.cpp
# Opt level: O3

void __thiscall
IRT::ConstEvaluateVisitor::Visit(ConstEvaluateVisitor *this,CExpressionList *expression)

{
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> _Var1;
  CExpressionList *pCVar2;
  CExpressionList *this_00;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar3;
  ulong uVar4;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_30;
  
  this_00 = (CExpressionList *)operator_new(0x20);
  CExpressionList::CExpressionList(this_00,(CExpression *)0x0);
  pvVar3 = CExpressionList::getExpressions(expression);
  if ((pvVar3->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (pvVar3->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      pvVar3 = CExpressionList::getExpressions(expression);
      _Var1._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
           (pvVar3->
           super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t;
      (*(code *)**(undefined8 **)
                  _Var1._M_t.
                  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                  .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl)
                (_Var1._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                 .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,this);
      local_30._M_head_impl =
           (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
      (this->childExpression)._M_t.
      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
      CExpressionList::Add
                (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                          *)&local_30);
      if (local_30._M_head_impl != (CExpression *)0x0) {
        (*((local_30._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      local_30._M_head_impl = (CExpression *)0x0;
      uVar4 = uVar4 + 1;
      pvVar3 = CExpressionList::getExpressions(expression);
    } while (uVar4 < (ulong)((long)(pvVar3->
                                   super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar3->
                                   super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pCVar2 = (this->childExpressionList)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
           .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl;
  (this->childExpressionList)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
  .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl = this_00;
  if (pCVar2 != (CExpressionList *)0x0) {
    (**(code **)((long)(pCVar2->super_IExpression).super_INode + 0x10))();
  }
  return;
}

Assistant:

void IRT::ConstEvaluateVisitor::Visit(const IRT::CExpressionList &expression) {
    CExpressionList* list = new CExpressionList();
    for (int i = 0; i < expression.getExpressions().size(); ++i) {
        expression.getExpressions()[i]->Accept((*this));
        list->Add(M(childExpression));
    }

    childExpressionList = M(std::unique_ptr<const CExpressionList>(list));
}